

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void deqp::egl::requireEGLExtension(Library *egl,EGLDisplay eglDisplay,char *requiredExtension)

{
  bool bVar1;
  NotSupportedError *this;
  allocator<char> local_61;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,requiredExtension,(allocator<char> *)&local_40);
  bVar1 = eglu::hasExtension(egl,eglDisplay,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    return;
  }
  this = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,requiredExtension,&local_61);
  std::operator+(&local_60,&local_40," not supported");
  tcu::NotSupportedError::NotSupportedError
            (this,local_60._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
             ,0x7e2);
  __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

static void requireEGLExtension (const Library& egl, EGLDisplay eglDisplay, const char* requiredExtension)
{
	if (!eglu::hasExtension(egl, eglDisplay, requiredExtension))
		TCU_THROW(NotSupportedError, (string(requiredExtension) + " not supported").c_str());
}